

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

void __thiscall pfederc::Lexer::skipSpace(Lexer *this)

{
  bool bVar1;
  Lexer *this_local;
  
  while( true ) {
    bVar1 = true;
    if ((this->currentChar != 0x20) && (bVar1 = true, this->currentChar != 9)) {
      bVar1 = this->currentChar == 0xb;
    }
    if (!bVar1) break;
    nextChar(this);
  }
  return;
}

Assistant:

void Lexer::skipSpace() noexcept {
  while (currentChar == ' ' || currentChar == '\t' || currentChar == '\v')
    nextChar();
}